

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::SetNumElConnected
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZVec<int> *numelconnected)

{
  TPZVec<int> *this_00;
  
  this_00 = &this->fNumElConnected;
  TPZVec<int>::Resize(this_00,numelconnected->fNElements);
  TPZVec<int>::operator=(this_00,numelconnected);
  TPZVec<int>::operator=(&this->fNumElConnectedBackup,this_00);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::SetNumElConnected(TPZVec < int > &numelconnected){
	fNumElConnected.Resize(numelconnected.NElements());
	fNumElConnected=numelconnected;
	fNumElConnectedBackup = fNumElConnected;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "fNumElConnected " << fNumElConnected;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}